

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lyd_parser_create_meta
                 (lyd_ctx *lydctx,lyd_node *parent,lyd_meta **meta,lys_module *mod,char *name,
                 size_t name_len,void *value,size_t value_len,ly_bool *dynamic,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *ctx_node)

{
  uint uVar1;
  int iVar2;
  LY_ERR LVar3;
  ly_bool incomplete;
  lyd_meta *local_50;
  lyd_ctx *local_48;
  char *path;
  lyd_node *local_38;
  
  path = (char *)0x0;
  uVar1 = lydctx->parse_opts;
  if (meta == (lyd_meta **)0x0) {
    local_50 = (lyd_meta *)0x0;
  }
  else {
    local_50 = *meta;
  }
  local_48 = lydctx;
  local_38 = parent;
  iVar2 = asprintf(&path,"/@%s:%.*s",mod->name,name_len & 0xffffffff,name);
  if (iVar2 == -1) {
    LVar3 = LY_EMEM;
    ly_log(local_48->data_ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyd_parser_create_meta");
    goto LAB_00165fb0;
  }
  ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,path,(ly_in *)0x0);
  LVar3 = lyd_create_meta(local_38,meta,mod,name,name_len,(char *)value,value_len,'\x01',
                          (~uVar1 & 0x2010000) == 0,dynamic,format,prefix_data,hints,ctx_node,'\0',
                          &incomplete);
  if (LVar3 != LY_SUCCESS) goto LAB_00165fb0;
  if ((incomplete == '\0') || ((local_48->parse_opts & 0x10000) != 0)) {
    if (local_50 != (lyd_meta *)0x0) goto LAB_00165fab;
  }
  else {
    LVar3 = ly_set_add(&local_48->meta_types,*meta,'\x01',(uint32_t *)0x0);
    if (local_50 == (lyd_meta *)0x0 || LVar3 != LY_SUCCESS) goto LAB_00165fb0;
LAB_00165fab:
    *meta = local_50;
  }
  LVar3 = LY_SUCCESS;
LAB_00165fb0:
  ly_log_location_revert(0,0,1,0);
  free(path);
  return LVar3;
}

Assistant:

LY_ERR
lyd_parser_create_meta(struct lyd_ctx *lydctx, struct lyd_node *parent, struct lyd_meta **meta, const struct lys_module *mod,
        const char *name, size_t name_len, const void *value, size_t value_len, ly_bool *dynamic, LY_VALUE_FORMAT format,
        void *prefix_data, uint32_t hints, const struct lysc_node *ctx_node)
{
    LY_ERR rc = LY_SUCCESS;
    char *path = NULL;
    ly_bool incomplete;
    struct lyd_meta *first = NULL;
    ly_bool store_only = (lydctx->parse_opts & LYD_PARSE_STORE_ONLY) == LYD_PARSE_STORE_ONLY ? 1 : 0;

    if (meta && *meta) {
        /* remember the first metadata */
        first = *meta;
    }

    /* generate path to the metadata */
    if (asprintf(&path, "/@%s:%.*s", mod->name, (int)name_len, name) == -1) {
        LOGMEM(lydctx->data_ctx->ctx);
        rc = LY_EMEM;
        goto cleanup;
    }
    ly_log_location(NULL, NULL, path, NULL);

    LY_CHECK_GOTO(rc = lyd_create_meta(parent, meta, mod, name, name_len, value, value_len, 1, store_only, dynamic, format,
            prefix_data, hints, ctx_node, 0, &incomplete), cleanup);

    if (incomplete && !(lydctx->parse_opts & LYD_PARSE_ONLY)) {
        LY_CHECK_GOTO(rc = ly_set_add(&lydctx->meta_types, *meta, 1, NULL), cleanup);
    }

    if (first) {
        /* always return the first metadata */
        *meta = first;
    }

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    free(path);
    return rc;
}